

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlineBuiltInFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,OpCode inlineCallOpCode,
          FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,bool *pIsInlined,uint profileId,
          uint recursiveInlineDepth,Instr *funcObjCheckInsertInstr)

{
  code *pcVar1;
  anon_class_64_8_1f55a2ea callback;
  bool bVar2;
  _E _Var3;
  bool bVar4;
  IRType IVar5;
  ArgSlot AVar6;
  OpCode opcode;
  uint uVar7;
  undefined4 *puVar8;
  SymOpnd *pSVar9;
  StackSym *pSVar10;
  char16 *inlineeName;
  JITTimeWorkItem *this_00;
  FunctionJITTimeInfo *topFunc;
  Func *pFVar11;
  Opnd *pOVar12;
  ByteCodeUsesInstr *pBVar13;
  Opnd *pOVar14;
  Instr *pIVar15;
  Instr *this_01;
  AddrOpnd *src2Opnd;
  RegOpnd *pRVar16;
  uint local_16c;
  RegOpnd *s5;
  Instr *orInstr;
  RegOpnd *s4;
  AddrOpnd *zeroOpnd;
  Func *func;
  Instr *local_f8;
  Instr *argInsertInstr;
  ByteCodeUsesInstr *byteCodeUsesInstr;
  Instr *pIStack_e0;
  int argIndex;
  Instr *ldInstr;
  StackSym *tmpSym;
  Opnd *callInstrDst;
  Opnd *tmpDst;
  Instr *inlineBuiltInStartInstr;
  StackSym *pSStack_b0;
  BuiltinFunction builtInFunctionId;
  StackSym *dstSym;
  Instr *argoutInstr;
  ByteCodeUsesInstr *useCallTargetInstr;
  bool originalCallTargetOpndIsJITOpt;
  StackSym *originalCallTargetStackSym;
  Instr *pIStack_80;
  bool isCallInstanceFunction;
  Instr *inlineBuiltInEndInstr;
  int inlineCallArgCount;
  bool usesThisArgument;
  ArgSlot actualCount;
  Opnd *linkOpnd;
  BuiltInFlags local_60;
  byte local_5a;
  BuiltinFunction local_59;
  BuiltInFlags builtInFlags;
  BuiltinFunction builtInId;
  StackSym *symCallerThis_local;
  FunctionJITTimeInfo *inlinerData_local;
  FunctionJITTimeInfo *pFStack_40;
  OpCode inlineCallOpCode_local;
  FunctionJITTimeInfo *inlineeData_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  _builtInFlags = symCallerThis;
  inlinerData_local._6_2_ = inlineCallOpCode;
  pFStack_40 = inlineeData;
  inlineeData_local = (FunctionJITTimeInfo *)callInstr;
  callInstr_local = (Instr *)this;
  if (callInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x804,"(callInstr)","callInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (inlinerData == (FunctionJITTimeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x805,"(inlinerData)","inlinerData");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar2 = Js::operator!=((OpCode *)((long)&inlinerData_local + 6),0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x806,"(inlineCallOpCode != 0)","inlineCallOpCode != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  *pIsInlined = false;
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFStack_40);
  local_5a = (byte)Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar7);
  local_59 = (BuiltinFunction)local_5a;
  bVar2 = CanInlineBuiltInFunction
                    (this,(Instr *)inlineeData_local,pFStack_40,inlinerData_local._6_2_,inlinerData,
                     (BuiltinFunction)local_5a,false);
  if (bVar2) {
    linkOpnd._7_1_ = local_59._value;
    local_60 = Js::JavascriptLibrary::GetFlagsForBuiltIn(local_59);
    _inlineCallArgCount = IR::Instr::GetSrc2((Instr *)inlineeData_local);
    pSVar9 = IR::Opnd::AsSymOpnd(_inlineCallArgCount);
    pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
    AVar6 = StackSym::GetArgSlotNum(pSVar10);
    bVar2 = (local_60 & BIF_UseSrc0) != BIF_None;
    if (bVar2) {
      local_16c = (uint)AVar6;
    }
    else {
      local_16c = AVar6 - 1;
    }
    if (inlinerData_local._6_2_ == InlineFunctionApply) {
      this_local = (Inline *)
                   InlineApply(this,(Instr *)inlineeData_local,pFStack_40,inlinerData,_builtInFlags,
                               pIsInlined,profileId,recursiveInlineDepth,local_16c - bVar2);
    }
    else if ((inlinerData_local._6_2_ == InlineFunctionCall) ||
            (inlinerData_local._6_2_ == InlineCallInstanceFunction)) {
      this_local = (Inline *)
                   InlineCall(this,(Instr *)inlineeData_local,pFStack_40,inlinerData,_builtInFlags,
                              pIsInlined,profileId,recursiveInlineDepth,
                              inlinerData_local._6_2_ == InlineCallInstanceFunction);
    }
    else {
      inlineeName = Js::JavascriptLibrary::GetNameForBuiltIn(local_59);
      this_00 = Func::GetWorkItem(this->topFunc);
      topFunc = JITTimeWorkItem::GetJITTimeInfo(this_00);
      pFVar11 = Func::GetTopFunc((Func *)(inlineeData_local->m_data).sharedPropertyGuards);
      bVar2 = Func::IsLoopBody(pFVar11);
      _Var3 = Js::BuiltinFunction::operator_cast_to__E(&local_59);
      TraceInlining(inlinerData,inlineeName,(char16 *)0x0,0,topFunc,0,(FunctionJITTimeInfo *)0x0,
                    profileId,bVar2,(uint)_Var3);
      *pIsInlined = true;
      pOVar12 = IR::Instr::GetSrc1((Instr *)inlineeData_local);
      pSVar10 = IR::Opnd::GetStackSym(pOVar12);
      pOVar12 = IR::Instr::GetSrc1((Instr *)inlineeData_local);
      bVar2 = IR::Opnd::GetIsJITOptimizedReg(pOVar12);
      pBVar13 = EmitFixedMethodOrFunctionObjectChecksForBuiltIns
                          (this,(Instr *)inlineeData_local,funcObjCheckInsertInstr,pFStack_40,false,
                           true,false,true);
      if (inlinerData_local._6_2_ == CallDirect) {
        pSStack_b0 = SymTable::GetArgSlotSym
                               (*(SymTable **)
                                 ((inlineeData_local->m_data).sharedPropertyGuards + 0x6e),1);
        pSVar9 = IR::SymOpnd::New(&pSStack_b0->super_Sym,0,TyUint64,
                                  (Func *)(inlineeData_local->m_data).sharedPropertyGuards);
        pOVar12 = IR::Instr::UnlinkSrc1((Instr *)inlineeData_local);
        pOVar14 = IR::Instr::UnlinkSrc2((Instr *)inlineeData_local);
        pIVar15 = IR::Instr::New(ArgOut_A_InlineSpecialized,&pSVar9->super_Opnd,pOVar12,pOVar14,
                                 (Func *)(inlineeData_local->m_data).sharedPropertyGuards);
        IR::Instr::SetByteCodeOffset(pIVar15,(Instr *)inlineeData_local);
        this_01 = IR::Instr::GetInsertBeforeByteCodeUsesInstr((Instr *)inlineeData_local);
        IR::Instr::InsertBefore(this_01,pIVar15);
        uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFStack_40);
        inlineBuiltInStartInstr._6_1_ = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar7);
        *(OpCode *)&(inlineeData_local->m_data).inlineeCount = inlinerData_local._6_2_;
        inlineBuiltInStartInstr._7_1_ = inlineBuiltInStartInstr._6_1_;
        SetupInlineInstrForCallDirect
                  (this,inlineBuiltInStartInstr._6_1_,(Instr *)inlineeData_local,pIVar15);
        inlineBuiltInStartInstr._5_1_ = inlineBuiltInStartInstr._7_1_;
        WrapArgsOutWithCoerse(this,inlineBuiltInStartInstr._7_1_,(Instr *)inlineeData_local);
        IR::Instr::MoveArgs((Instr *)inlineeData_local,true);
        pIStack_80 = (Instr *)inlineeData_local;
      }
      else {
        pIStack_80 = InsertInlineeBuiltInStartEndTags
                               (this,(Instr *)inlineeData_local,(uint)AVar6,(Instr **)0x0);
        if (inlinerData_local._6_2_ == InlineArrayPop) {
          pIStack_80->m_opcode = InlineNonTrackingBuiltInEnd;
        }
      }
      if (pBVar13 != (ByteCodeUsesInstr *)0x0) {
        IR::Instr::Unlink(&pBVar13->super_Instr);
        IR::Instr::InsertBefore((Instr *)inlineeData_local,&pBVar13->super_Instr);
      }
      bVar4 = Js::JavascriptLibrary::IsTypeSpecRequired(local_60);
      if (bVar4) {
        for (tmpDst = (Opnd *)pIStack_80; *(short *)&tmpDst[3]._vptr_Opnd != 0x24c;
            tmpDst = *(Opnd **)&tmpDst[1].m_valueType) {
        }
        callInstrDst = (Opnd *)0x0;
        tmpSym = (StackSym *)IR::Instr::GetDst((Instr *)inlineeData_local);
        if ((tmpSym == (StackSym *)0x0) || (inlinerData_local._6_2_ == InlineArrayPop)) {
          if ((inlinerData_local._6_2_ != InlineArrayPush) &&
             (inlinerData_local._6_2_ != InlineArrayPop)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x873,
                               "(inlineCallOpCode == Js::OpCode::InlineArrayPush || inlineCallOpCode == Js::OpCode::InlineArrayPop)"
                               ,"Currently Dst can be null only for InlineArrayPush/InlineArrayPop")
            ;
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
        }
        else {
          pOVar12 = IR::Instr::GetDst((Instr *)inlineeData_local);
          IVar5 = IR::Opnd::GetType(pOVar12);
          pIVar15 = (Instr *)StackSym::New(IVar5,(Func *)(inlineeData_local->m_data).
                                                         sharedPropertyGuards);
          ldInstr = pIVar15;
          IVar5 = StackSym::GetType((StackSym *)pIVar15);
          callInstrDst = &IR::RegOpnd::New((StackSym *)pIVar15,IVar5,
                                           (Func *)(inlineeData_local->m_data).sharedPropertyGuards)
                          ->super_Opnd;
          tmpSym = (StackSym *)IR::Instr::UnlinkDst((Instr *)inlineeData_local);
          IR::Instr::SetDst((Instr *)inlineeData_local,callInstrDst);
        }
        pIVar15 = IR::Instr::GetPrevRealInstrOrLabel((Instr *)inlineeData_local);
        pBVar13 = IR::ByteCodeUsesInstr::New(pIVar15);
        IR::ByteCodeUsesInstr::SetRemovedOpndSymbol(pBVar13,bVar2,(pSVar10->super_Sym).m_id);
        if (inlinerData_local._6_2_ == InlineArrayPop) {
          IR::Instr::InsertBefore((Instr *)inlineeData_local,&pBVar13->super_Instr);
        }
        else {
          IR::Instr::InsertBefore(pIStack_80,&pBVar13->super_Instr);
        }
        if (callInstrDst != (Opnd *)0x0) {
          IVar5 = IR::Opnd::GetType((Opnd *)tmpSym);
          opcode = Func::GetLoadOpForType(IVar5);
          pIStack_e0 = IR::Instr::New(opcode,(Opnd *)tmpSym,callInstrDst,
                                      (Func *)(inlineeData_local->m_data).sharedPropertyGuards);
          IR::Instr::InsertBefore(pIStack_80,pIStack_e0);
        }
        IR::Instr::UnlinkSrc1((Instr *)inlineeData_local);
        IR::Instr::UnlinkSrc2((Instr *)inlineeData_local);
        *(OpCode *)&(inlineeData_local->m_data).inlineeCount = inlinerData_local._6_2_;
        byteCodeUsesInstr._4_4_ = local_16c;
        argInsertInstr = &IR::ByteCodeUsesInstr::New((Instr *)inlineeData_local)->super_Instr;
        local_f8 = (Instr *)tmpDst;
        callback.inlineCallOpCode._0_4_ = (int)((long)&inlinerData_local + 6);
        callback.linkOpnd = (Opnd **)&inlineCallArgCount;
        callback.inlineCallOpCode._4_4_ = (int)((ulong)((long)&inlinerData_local + 6) >> 0x20);
        callback.callInstrDst._0_4_ = (int)&tmpSym;
        callback.callInstrDst._4_4_ = (int)((ulong)&tmpSym >> 0x20);
        callback.byteCodeUsesInstr._0_4_ = (int)&argInsertInstr;
        callback.byteCodeUsesInstr._4_4_ = (int)((ulong)&argInsertInstr >> 0x20);
        callback.this = this;
        callback.argIndex = (int *)((long)&byteCodeUsesInstr + 4);
        callback.callInstr = (Instr **)&inlineeData_local;
        callback.argInsertInstr = &local_f8;
        IR::Instr::
        IterateArgInstrs<Inline::InlineBuiltInFunction(IR::Instr*,FunctionJITTimeInfo_const*,Js::OpCode,FunctionJITTimeInfo_const*,StackSym_const*,bool*,unsigned_int,unsigned_int,IR::Instr*)::__0>
                  (pIStack_80,callback);
        if ((inlinerData_local._6_2_ == InlineMathImul) ||
           (inlinerData_local._6_2_ == InlineMathClz)) {
          pFVar11 = (Func *)(inlineeData_local->m_data).sharedPropertyGuards;
          src2Opnd = IR::AddrOpnd::NewFromNumber(0,pFVar11,true);
          pRVar16 = IR::RegOpnd::New(TyVar,pFVar11);
          IR::Opnd::SetIsJITOptimizedReg(&pRVar16->super_Opnd,true);
          pOVar12 = IR::Instr::UnlinkSrc1((Instr *)inlineeData_local);
          pIVar15 = IR::Instr::New(Or_A,&pRVar16->super_Opnd,pOVar12,&src2Opnd->super_Opnd,pFVar11);
          IR::Instr::SetByteCodeOffset(pIVar15,(Instr *)inlineeData_local);
          IR::Instr::InsertBefore((Instr *)inlineeData_local,pIVar15);
          IR::Instr::SetSrc1((Instr *)inlineeData_local,&pRVar16->super_Opnd);
          if (inlinerData_local._6_2_ == InlineMathImul) {
            pOVar12 = IR::Instr::GetSrc2((Instr *)inlineeData_local);
            pOVar14 = IR::Instr::GetSrc1((Instr *)inlineeData_local);
            bVar2 = IR::Opnd::IsEqual(pOVar12,pOVar14);
            if (bVar2) {
              IR::Instr::ReplaceSrc2((Instr *)inlineeData_local,&pRVar16->super_Opnd);
            }
            else {
              pRVar16 = IR::RegOpnd::New(TyVar,pFVar11);
              IR::Opnd::SetIsJITOptimizedReg(&pRVar16->super_Opnd,true);
              pOVar12 = IR::Instr::UnlinkSrc2((Instr *)inlineeData_local);
              pIVar15 = IR::Instr::New(Or_A,&pRVar16->super_Opnd,pOVar12,&src2Opnd->super_Opnd,
                                       pFVar11);
              IR::Instr::SetByteCodeOffset(pIVar15,(Instr *)inlineeData_local);
              IR::Instr::InsertBefore((Instr *)inlineeData_local,pIVar15);
              IR::Instr::SetSrc2((Instr *)inlineeData_local,&pRVar16->super_Opnd);
            }
          }
        }
        bVar2 = OpCodeAttr::BailOutRec(inlinerData_local._6_2_);
        if (bVar2) {
          IR::Instr::InsertBefore(pIStack_80,argInsertInstr);
        }
        pRVar16 = IR::Opnd::AsRegOpnd(_inlineCallArgCount);
        pIVar15 = StackSym::GetInstrDef(pRVar16->m_sym);
        if (pIVar15->m_opcode != StartCall) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x8ea,
                             "(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall)"
                             ,
                             "linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pRVar16 = IR::Opnd::AsRegOpnd(_inlineCallArgCount);
        pIVar15 = StackSym::GetInstrDef(pRVar16->m_sym);
        uVar7 = IR::Instr::GetArgOutCount(pIVar15,false);
        if (uVar7 != AVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x8eb,
                             "(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount( false) == actualCount)"
                             ,
                             "linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount( false) == actualCount"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pRVar16 = IR::Opnd::AsRegOpnd(_inlineCallArgCount);
        *(uint *)&pRVar16->m_sym->field_0x18 =
             *(uint *)&pRVar16->m_sym->field_0x18 & 0xffffbfff | 0x4000;
        bVar2 = OpCodeAttr::BailOutRec(inlinerData_local._6_2_);
        if (bVar2) {
          IR::Instr::ConvertToBailOutInstr
                    ((Instr *)inlineeData_local,(Instr *)inlineeData_local,BailOutOnFloor,0xffffffff
                    );
        }
      }
      this_local = (Inline *)pIStack_80->m_next;
    }
  }
  else {
    this_local = (Inline *)(inlineeData_local->m_data).inlineesBv;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Inline::InlineBuiltInFunction(
    IR::Instr *callInstr,
    const FunctionJITTimeInfo * inlineeData,
    Js::OpCode inlineCallOpCode,
    const FunctionJITTimeInfo * inlinerData, 
    const StackSym *symCallerThis, 
    bool* pIsInlined, 
    uint profileId, 
    uint recursiveInlineDepth, 
    IR::Instr * funcObjCheckInsertInstr)
{
    Assert(callInstr);
    Assert(inlinerData);
    Assert(inlineCallOpCode != 0);

    // We may still decide not to inline.
    *pIsInlined = false;

    // Inlining is profile-based, so get the built-in function from profile rather than from the callInstr's opnd.
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());
    if (!CanInlineBuiltInFunction(callInstr, inlineeData, inlineCallOpCode, inlinerData, builtInId, false))
    {
        return callInstr->m_next;
    }

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
    IR::Opnd * linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();

    bool usesThisArgument = (builtInFlags & Js::BuiltInFlags::BIF_UseSrc0) != 0;
    int inlineCallArgCount = (int)(usesThisArgument ? actualCount : actualCount - 1);

    IR::Instr *inlineBuiltInEndInstr = nullptr;
    if (inlineCallOpCode == Js::OpCode::InlineFunctionApply)
    {
        return InlineApply(callInstr, inlineeData, inlinerData, symCallerThis, pIsInlined, profileId, recursiveInlineDepth, inlineCallArgCount - (usesThisArgument ? 1 : 0));
    }

    if (inlineCallOpCode == Js::OpCode::InlineFunctionCall || inlineCallOpCode == Js::OpCode::InlineCallInstanceFunction)
    {
        const bool isCallInstanceFunction = (inlineCallOpCode == Js::OpCode::InlineCallInstanceFunction);
        return InlineCall(callInstr, inlineeData, inlinerData, symCallerThis, pIsInlined, profileId, recursiveInlineDepth, isCallInstanceFunction);
    }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    TraceInlining(inlinerData, Js::JavascriptLibrary::GetNameForBuiltIn(builtInId),
        nullptr, 0, this->topFunc->GetWorkItem()->GetJITTimeInfo(), 0, nullptr, profileId, callInstr->m_func->GetTopFunc()->IsLoopBody(), builtInId);
#endif

    // From now on we are committed to inlining.
    *pIsInlined = true;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    IR::ByteCodeUsesInstr* useCallTargetInstr = EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, funcObjCheckInsertInstr, inlineeData, false, true, false, true);

    // To push function object for cases when we have to make calls to helper method to assist in inlining
    if (inlineCallOpCode == Js::OpCode::CallDirect)
    {
        IR::Instr* argoutInstr;
        StackSym *dstSym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
        argoutInstr = IR::Instr::New(Js::OpCode::ArgOut_A_InlineSpecialized, IR::SymOpnd::New(dstSym, 0, TyMachPtr, callInstr->m_func), callInstr->UnlinkSrc1(), callInstr->UnlinkSrc2(), callInstr->m_func);
        argoutInstr->SetByteCodeOffset(callInstr);
        callInstr->GetInsertBeforeByteCodeUsesInstr()->InsertBefore(argoutInstr);

        Js::BuiltinFunction builtInFunctionId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());


        callInstr->m_opcode = inlineCallOpCode;
        SetupInlineInstrForCallDirect(builtInFunctionId, callInstr, argoutInstr);

        WrapArgsOutWithCoerse(builtInFunctionId, callInstr);

        // Generate ByteCodeArgOutCaptures and move the ArgOut_A/ArgOut_A_Inline close to the call instruction
        callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

        inlineBuiltInEndInstr = callInstr;
    }
    else
    {
        inlineBuiltInEndInstr = InsertInlineeBuiltInStartEndTags(callInstr, actualCount);

        // InlineArrayPop - TrackCalls Need to be done at InlineArrayPop and not at the InlineBuiltInEnd
        // Hence we use a new opcode, to detect that it is an InlineArrayPop and we don't track the call during End of inlineBuiltInCall sequence
        if (inlineCallOpCode == Js::OpCode::InlineArrayPop)
        {
            inlineBuiltInEndInstr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;
        }
    }

    if (useCallTargetInstr)
    {
        useCallTargetInstr->Unlink();
        callInstr->InsertBefore(useCallTargetInstr);
    }

    if (Js::JavascriptLibrary::IsTypeSpecRequired(builtInFlags))
    {
        // Emit byteCodeUses for function object
        IR::Instr * inlineBuiltInStartInstr = inlineBuiltInEndInstr;
        while (inlineBuiltInStartInstr->m_opcode != Js::OpCode::InlineBuiltInStart)
        {
            inlineBuiltInStartInstr = inlineBuiltInStartInstr->m_prev;
        }

        IR::Opnd * tmpDst = nullptr;
        IR::Opnd * callInstrDst = callInstr->GetDst();

        if (callInstrDst && inlineCallOpCode != Js::OpCode::InlineArrayPop)
        {
            StackSym * tmpSym = StackSym::New(callInstr->GetDst()->GetType(), callInstr->m_func);
            tmpDst = IR::RegOpnd::New(tmpSym, tmpSym->GetType(), callInstr->m_func);

            callInstrDst = callInstr->UnlinkDst();
            callInstr->SetDst(tmpDst);
        }
        else
        {
            AssertMsg(inlineCallOpCode == Js::OpCode::InlineArrayPush || inlineCallOpCode == Js::OpCode::InlineArrayPop,
                "Currently Dst can be null only for InlineArrayPush/InlineArrayPop");
        }

        // Insert a byteCodeUsesInstr to make sure the function object's lifetime is extended beyond the last bailout point
        // at which we may need to call the inlinee again in the interpreter.
        useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr->GetPrevRealInstrOrLabel());
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);

        if (inlineCallOpCode == Js::OpCode::InlineArrayPop)
        {
            callInstr->InsertBefore(useCallTargetInstr);
        }
        else
        {
            inlineBuiltInEndInstr->InsertBefore(useCallTargetInstr);
        }

        if (tmpDst)
        {
            IR::Instr * ldInstr = IR::Instr::New(Func::GetLoadOpForType(callInstrDst->GetType()), callInstrDst, tmpDst, callInstr->m_func);
            inlineBuiltInEndInstr->InsertBefore(ldInstr);
        }

        // Set srcs of the callInstr, and process ArgOuts.
        callInstr->UnlinkSrc1();
        callInstr->UnlinkSrc2();
        callInstr->m_opcode = inlineCallOpCode;

        int argIndex = inlineCallArgCount;    // We'll use it to fill call instr srcs from upper to lower.


        IR::ByteCodeUsesInstr * byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(callInstr);
        IR::Instr *argInsertInstr = inlineBuiltInStartInstr;

        inlineBuiltInEndInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
            StackSym *linkSym = linkOpnd->GetStackSym();
            linkSym->m_isInlinedArgSlot = true;
            linkSym->m_allocated = true;

            // We are going to replace the use on the call (below), insert byte code use if necessary
            if (OpCodeAttr::BailOutRec(inlineCallOpCode))
            {
                StackSym * sym = argInstr->GetSrc1()->GetStackSym();
                if (sym->HasByteCodeRegSlot() && (!sym->m_isSingleDef || !sym->m_instrDef->GetSrc1() || !sym->m_instrDef->GetSrc1()->IsConstOpnd()))
                {
                    if (!sym->IsFromByteCodeConstantTable() && sym->GetByteCodeRegSlot() != callInstrDst->GetStackSym()->GetByteCodeRegSlot())
                    {
                        byteCodeUsesInstr->Set(argInstr->GetSrc1());
                    }
                }
            }

            // Convert the arg out to built in arg out, and get the src of the arg out
            IR::Opnd * argOpnd = ConvertToInlineBuiltInArgOut(argInstr);
            // Use parameter to the inline call to tempDst.
            if (argIndex == 2)
            {
                callInstr->SetSrc2(argOpnd);
                // Prevent inserting ByteCodeUses instr during globopt, as we already track the src in ArgOut.
                callInstr->GetSrc2()->SetIsJITOptimizedReg(true);
            }
            else if (argIndex == 1)
            {
                callInstr->SetSrc1(argOpnd);
                // Prevent inserting ByteCodeUses instr during globopt, as we already track the src in ArgOut.
                callInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            }

            argIndex--;

            linkOpnd = argInstr->GetSrc2();

            // Move the arguments next to the call.
            argInstr->Move(argInsertInstr);
            argInsertInstr = argInstr;
            return false;
        });

        if (inlineCallOpCode == Js::OpCode::InlineMathImul || inlineCallOpCode == Js::OpCode::InlineMathClz)
        {
            // Convert:
            //     s1 = InlineMathImul s2, s3
            // Into:
            //     s4 = Or_A s2, 0
            //     s5 = Or_A s3, 0
            //     s1 = InlineMathImul s4, s5

            Func *const func = callInstr->m_func;
            IR::AddrOpnd *const zeroOpnd = IR::AddrOpnd::NewFromNumber(0, func, true);

            IR::RegOpnd *const s4 = IR::RegOpnd::New(TyVar, func);
            s4->SetIsJITOptimizedReg(true);
            IR::Instr *orInstr = IR::Instr::New(Js::OpCode::Or_A, s4, callInstr->UnlinkSrc1(), zeroOpnd, func);
            orInstr->SetByteCodeOffset(callInstr);
            callInstr->InsertBefore(orInstr);
            callInstr->SetSrc1(s4);
            if (inlineCallOpCode == Js::OpCode::InlineMathImul)
            {
                if (callInstr->GetSrc2()->IsEqual(callInstr->GetSrc1()))
                {
                    callInstr->ReplaceSrc2(s4);
                }
                else
                {
                    IR::RegOpnd *const s5 = IR::RegOpnd::New(TyVar, func);
                    s5->SetIsJITOptimizedReg(true);
                    orInstr = IR::Instr::New(Js::OpCode::Or_A, s5, callInstr->UnlinkSrc2(), zeroOpnd, func);
                    orInstr->SetByteCodeOffset(callInstr);
                    callInstr->InsertBefore(orInstr);
                    callInstr->SetSrc2(s5);
                }
            }
        }

        if (OpCodeAttr::BailOutRec(inlineCallOpCode))
        {
            inlineBuiltInEndInstr->InsertBefore(byteCodeUsesInstr);
        }

        Assert(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall);
        Assert(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == actualCount);

        // Mark the StartCall's dst as an inlined arg slot as well so we know this is an inlined start call
        // and not adjust the stack height on x86
        linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;

        if (OpCodeAttr::BailOutRec(inlineCallOpCode))
        {
            callInstr = callInstr->ConvertToBailOutInstr(callInstr, IR::BailOutOnFloor);
        }
    }
    return inlineBuiltInEndInstr->m_next;
}